

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O3

CFGNode * __thiscall
dxil_spv::CFGStructurizer::create_helper_pred_block(CFGStructurizer *this,CFGNode *node)

{
  pointer pcVar1;
  pointer ppCVar2;
  pointer ppCVar3;
  pointer ppCVar4;
  uint32_t uVar5;
  CFGNode *to;
  CFGNode *pCVar6;
  pointer ppCVar7;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> local_48;
  
  to = CFGNodePool::create_node(this->pool);
  pcVar1 = (node->name)._M_dataplus._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>::
  _M_construct<char*>((basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>
                       *)&local_48,pcVar1,pcVar1 + (node->name)._M_string_length);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  append(&local_48,".pred");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  operator=(&to->name,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    free_in_thread(local_48._M_dataplus._M_p);
  }
  uVar5 = node->backward_post_visit_order;
  to->forward_post_visit_order = node->forward_post_visit_order;
  to->backward_post_visit_order = uVar5;
  ppCVar7 = (to->pred).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  ppCVar2 = (node->pred).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppCVar3 = (to->pred).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppCVar4 = (to->pred).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  (to->pred).
  super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (node->pred).
       super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (to->pred).
  super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = ppCVar2;
  (to->pred).
  super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (node->pred).
       super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (node->pred).
  super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
  _M_impl.super__Vector_impl_data._M_start = ppCVar3;
  (node->pred).
  super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = ppCVar4;
  (node->pred).
  super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = ppCVar7;
  ppCVar7 = (node->headers).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppCVar2 = (node->headers).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppCVar7 != ppCVar2) {
    do {
      CFGNode::fixup_merge_info_after_branch_rewrite(*ppCVar7,node,to);
      ppCVar7 = ppCVar7 + 1;
    } while (ppCVar7 != ppCVar2);
    ppCVar7 = (node->headers).
              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((node->headers).
        super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppCVar7) {
      (node->headers).
      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = ppCVar7;
    }
  }
  node->split_merge_block_candidate = to;
  pCVar6 = to;
  if (node->immediate_dominator != node) {
    pCVar6 = node->immediate_dominator;
  }
  to->immediate_dominator = pCVar6;
  to->immediate_post_dominator = node;
  node->immediate_dominator = to;
  retarget_pred_from(this,to,node);
  CFGNode::add_branch(to,node);
  if (this->entry_block == node) {
    this->entry_block = to;
  }
  (to->ir).terminator.type = Branch;
  (to->ir).terminator.direct_block = node;
  return to;
}

Assistant:

CFGNode *CFGStructurizer::create_helper_pred_block(CFGNode *node)
{
	auto *pred_node = pool.create_node();
	pred_node->name = node->name + ".pred";

	// Fixup visit order later.
	pred_node->forward_post_visit_order = node->forward_post_visit_order;
	pred_node->backward_post_visit_order = node->backward_post_visit_order;

	std::swap(pred_node->pred, node->pred);
	for (auto *header : node->headers)
		header->fixup_merge_info_after_branch_rewrite(node, pred_node);
	node->headers.clear();

	// When splitting merge scopes, need to consider these pred blocks as well
	// since they might end up with headers.size() >= 2.
	node->split_merge_block_candidate = pred_node;

	// We're replacing entry block.
	if (node == node->immediate_dominator)
		pred_node->immediate_dominator = pred_node;
	else
		pred_node->immediate_dominator = node->immediate_dominator;

	pred_node->immediate_post_dominator = node;
	node->immediate_dominator = pred_node;

	retarget_pred_from(pred_node, node);

	pred_node->add_branch(node);

	if (node == entry_block)
		entry_block = pred_node;

	pred_node->ir.terminator.type = Terminator::Type::Branch;
	pred_node->ir.terminator.direct_block = node;

	return pred_node;
}